

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportwriter.cpp
# Opt level: O1

void __thiscall ReportWriter::writeLinkHeader(ReportWriter *this)

{
  ofstream *poVar1;
  long lVar2;
  long lVar3;
  pointer pcVar4;
  ostream *poVar5;
  size_type *local_68;
  string s1;
  long local_40;
  undefined1 local_38 [16];
  
  poVar1 = this->sout;
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffff4f | 0x20;
  local_68 = &s1._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_68,'H');
  poVar5 = (ostream *)this->sout;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_68,(long)s1._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = (ostream *)this->sout;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  poVar5 = (ostream *)this->sout;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"   Flow Rate     Leakage    Velocity   Head Loss      Status",0x3c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = (ostream *)this->sout;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Link",6);
  poVar5 = (ostream *)this->sout;
  lVar2 = *(long *)poVar5;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xffffff4f | 0x80;
  *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x10) = 0xc;
  pcVar4 = (this->network->units).names[5]._M_dataplus._M_p;
  s1.field_2._8_8_ = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&s1.field_2 + 8),pcVar4,
             pcVar4 + (this->network->units).names[5]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)s1.field_2._8_8_,local_40);
  if ((undefined1 *)s1.field_2._8_8_ != local_38) {
    operator_delete((void *)s1.field_2._8_8_);
  }
  poVar5 = (ostream *)this->sout;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xc;
  pcVar4 = (this->network->units).names[5]._M_dataplus._M_p;
  s1.field_2._8_8_ = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&s1.field_2 + 8),pcVar4,
             pcVar4 + (this->network->units).names[5]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)s1.field_2._8_8_,local_40);
  if ((undefined1 *)s1.field_2._8_8_ != local_38) {
    operator_delete((void *)s1.field_2._8_8_);
  }
  poVar5 = (ostream *)this->sout;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xc;
  pcVar4 = (this->network->units).names[6]._M_dataplus._M_p;
  s1.field_2._8_8_ = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&s1.field_2 + 8),pcVar4,
             pcVar4 + (this->network->units).names[6]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)s1.field_2._8_8_,local_40);
  if ((undefined1 *)s1.field_2._8_8_ != local_38) {
    operator_delete((void *)s1.field_2._8_8_);
  }
  poVar5 = (ostream *)this->sout;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xc;
  pcVar4 = (this->network->units).names[7]._M_dataplus._M_p;
  s1.field_2._8_8_ = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&s1.field_2 + 8),pcVar4,
             pcVar4 + (this->network->units).names[7]._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)s1.field_2._8_8_,local_40);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((undefined1 *)s1.field_2._8_8_ != local_38) {
    operator_delete((void *)s1.field_2._8_8_);
  }
  poVar5 = (ostream *)this->sout;
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_68,(long)s1._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_68 != &s1._M_string_length) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void ReportWriter::writeLinkHeader()
{
    sout << left;
    string s1(72, '-');
    sout << "  " << s1 << endl;
    sout << setw(26) << " ";
    sout << "   Flow Rate     Leakage    Velocity   Head Loss      Status" << endl;

    sout << setw(26) << "  Link";
    sout << right;
    sout << setw(12) << network->getUnits(Units::FLOW);
    sout << setw(12) << network->getUnits(Units::FLOW);
    sout << setw(12) << network->getUnits(Units::VELOCITY);
    sout << setw(12) << network->getUnits(Units::HEADLOSS) << endl;

    sout << left;
    sout << "  " << s1 << endl;
}